

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_symbol(char *value)

{
  LOGGER_LOG p_Var1;
  size_t sVar2;
  void *pvVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t length;
  LOGGER_LOG l;
  AMQP_VALUE result;
  char *value_local;
  
  if (value == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_symbol",0x483,1,"NULL argument");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    sVar2 = strlen(value);
    if (sVar2 < 0xffffffff) {
      l = (LOGGER_LOG)REFCOUNT_AMQP_VALUE_DATA_Create();
      if ((AMQP_VALUE_DATA *)l == (AMQP_VALUE_DATA *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_create_symbol",0x495,1,"Cannot allocate memory for AMQP value");
        }
        l = (LOGGER_LOG)0x0;
      }
      else {
        ((AMQP_VALUE_DATA *)l)->type = AMQP_TYPE_SYMBOL;
        pvVar3 = malloc(sVar2 + 1);
        (((AMQP_VALUE_DATA *)l)->value).binary_value.bytes = pvVar3;
        if ((((AMQP_VALUE_DATA *)l)->value).described_value.descriptor == (AMQP_VALUE)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"amqpvalue_create_symbol",0x49f,1,"Cannot allocate memory for symbol string")
            ;
          }
          REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          memcpy((((AMQP_VALUE_DATA *)l)->value).binary_value.bytes,value,sVar2 + 1);
        }
      }
    }
    else {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_symbol",0x48c,1,"string too long to be represented as a symbol"
                 );
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return (AMQP_VALUE)l;
}

Assistant:

AMQP_VALUE amqpvalue_create_symbol(const char* value)
{
    AMQP_VALUE result;
    if (value == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_400: [If value is NULL, amqpvalue_create_symbol shall fail and return NULL.] */
        LogError("NULL argument");
        result = NULL;
    }
    else
    {
        size_t length = strlen(value);
        if (length >= UINT32_MAX)
        {
            /* Codes_SRS_AMQPVALUE_01_401: [ If the string pointed to by value is longer than 2^32-1 then amqpvalue_create_symbol shall return NULL. ]*/
            LogError("string too long to be represented as a symbol");
            result = NULL;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_143: [If allocating the AMQP_VALUE fails then amqpvalue_create_symbol shall return NULL.] */
            result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
            if (result == NULL)
            {
                LogError("Cannot allocate memory for AMQP value");
                result = NULL;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_142: [amqpvalue_create_symbol shall return a handle to an AMQP_VALUE that stores a symbol (ASCII string) value.] */
                result->type = AMQP_TYPE_SYMBOL;
                result->value.symbol_value.chars = (char*)malloc(length + 1);
                if (result->value.symbol_value.chars == NULL)
                {
                    LogError("Cannot allocate memory for symbol string");
                    REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                    result = NULL;
                }
                else
                {
                    (void)memcpy(result->value.symbol_value.chars, value, length + 1);
                }
            }
        }
    }

    return result;
}